

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_utils.h
# Opt level: O0

char * pcp_strndup(char *s,size_t size)

{
  void *pvVar1;
  char *__dest;
  char *end;
  char *ret;
  size_t size_local;
  char *s_local;
  
  pvVar1 = memchr(s,0,size);
  if (pvVar1 == (void *)0x0) {
    ret = (char *)(size + 1);
  }
  else {
    ret = (char *)((long)pvVar1 + (1 - (long)s));
  }
  __dest = (char *)malloc((size_t)ret);
  if (__dest != (char *)0x0) {
    memcpy(__dest,s,(size_t)ret);
    __dest[(long)(ret + -1)] = '\0';
  }
  return __dest;
}

Assistant:

static inline char *pcp_strndup(const char *s, size_t size) {
    char *ret;
    char *end = memchr(s, 0, size);

    if (end) {
        /* Length + 1 */
        size = end - s + 1;
    } else {
        size++;
    }
    ret = malloc(size);

    if (ret) {
        memcpy(ret, s, size);
        ret[size - 1] = '\0';
    }
    return ret;
}